

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  char *local_58;
  byte local_49;
  byte *pbStack_48;
  uchar in;
  char *ns;
  size_t alloc;
  urlreject ctrl_local;
  size_t *olen_local;
  char **ostring_local;
  size_t length_local;
  char *string_local;
  
  local_58 = (char *)length;
  if (length == 0) {
    local_58 = (char *)strlen(string);
  }
  ns = local_58;
  pbStack_48 = (byte *)(*Curl_cmalloc)((size_t)(local_58 + 1));
  if (pbStack_48 == (byte *)0x0) {
    string_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ostring = (char *)pbStack_48;
    length_local = (size_t)string;
    while (ns != (char *)0x0) {
      local_49 = *(byte *)length_local;
      if (((local_49 == 0x25) && ((char *)0x2 < ns)) &&
         (((('/' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < ':')) ||
           ((('`' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < 'g')) ||
            (('@' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < 'G')))))) &&
          (((('/' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < ':')) ||
            (('`' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < 'g')))) ||
           (('@' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < 'G')))))))) {
        local_49 = ""[*(char *)(length_local + 1) + -0x30] << 4 |
                   ""[*(char *)(length_local + 2) + -0x30];
        length_local = length_local + 3;
        ns = ns + -3;
      }
      else {
        length_local = length_local + 1;
        ns = ns + -1;
      }
      if (((ctrl == REJECT_CTRL) && (local_49 < 0x20)) || ((ctrl == REJECT_ZERO && (local_49 == 0)))
         ) {
        (*Curl_cfree)(*ostring);
        *ostring = (char *)0x0;
        return CURLE_URL_MALFORMAT;
      }
      *pbStack_48 = local_49;
      pbStack_48 = pbStack_48 + 1;
    }
    *pbStack_48 = 0;
    if (olen != (size_t *)0x0) {
      *olen = (long)pbStack_48 - (long)*ostring;
    }
    string_local._4_4_ = CURLE_OK;
  }
  return string_local._4_4_;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length ? length : strlen(string));
  ns = malloc(alloc + 1);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  /* store output string */
  *ostring = ns;

  while(alloc) {
    unsigned char in = (unsigned char)*string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      in = (unsigned char)(onehex2dec(string[1]) << 4) | onehex2dec(string[2]);

      string += 3;
      alloc -= 3;
    }
    else {
      string++;
      alloc--;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      Curl_safefree(*ostring);
      return CURLE_URL_MALFORMAT;
    }

    *ns++ = (char)in;
  }
  *ns = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = ns - *ostring;

  return CURLE_OK;
}